

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reslist.cpp
# Opt level: O2

TableResource * table_open(SRBRoot *bundle,char *tag,UString *comment,UErrorCode *status)

{
  TableResource *this;
  
  this = (TableResource *)operator_new(0x58);
  TableResource::TableResource(this,bundle,tag,comment,status);
  if (U_ZERO_ERROR < *status) {
    (*(this->super_ContainerResource).super_SResource._vptr_SResource[1])(this);
    this = (TableResource *)0x0;
  }
  return this;
}

Assistant:

TableResource* table_open(struct SRBRoot *bundle, const char *tag, const struct UString* comment, UErrorCode *status) {
    LocalPointer<TableResource> res(new TableResource(bundle, tag, comment, *status), *status);
    return U_SUCCESS(*status) ? res.orphan() : NULL;
}